

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_check_collapse.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::check_collapse_exposure
          (Omega_h *this,Mesh *mesh,LOs *cands2edges,Read<signed_char> *cand_codes,Int cell_dim)

{
  void **__return_storage_ptr__;
  uint uVar1;
  LO size_in;
  void *extraout_RDX;
  Read<signed_char> RVar2;
  undefined4 local_2b8;
  undefined4 local_2a8;
  undefined4 local_29c;
  undefined4 local_294;
  Write<signed_char> local_268;
  undefined1 local_258 [8];
  type f;
  string local_1b0 [32];
  undefined1 local_190 [8];
  Write<signed_char> cand_codes_w;
  LO ncands;
  undefined1 local_158 [8];
  Read<signed_char> s2dim;
  string local_140 [32];
  undefined1 local_120 [8];
  Read<signed_char> c2dim;
  Int nccs;
  Read<int> local_f8 [2];
  undefined1 local_d8 [8];
  LOs cs2s;
  Read<signed_char> ec_codes;
  LOs ec2c;
  undefined1 local_98 [8];
  LOs e2ec;
  Adj e2c;
  Int cell_dim_local;
  Read<signed_char> *cand_codes_local;
  LOs *cands2edges_local;
  Mesh *mesh_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  __return_storage_ptr__ = &e2ec.write_.shared_alloc_.direct_ptr;
  e2c.codes.write_.shared_alloc_.direct_ptr._4_4_ = cell_dim;
  Mesh::ask_up((Adj *)__return_storage_ptr__,mesh,1,cell_dim);
  Read<int>::Read((Read<int> *)local_98,(Read<int> *)__return_storage_ptr__);
  Read<int>::Read((Read<int> *)&ec_codes.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&e2c.super_Graph.a2ab.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::Read
            ((Read<signed_char> *)&cs2s.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)&e2c.super_Graph.ab2b.write_.shared_alloc_.direct_ptr);
  Mesh::ask_down((Adj *)&stack0xfffffffffffffef8,mesh,
                 e2c.codes.write_.shared_alloc_.direct_ptr._4_4_,
                 e2c.codes.write_.shared_alloc_.direct_ptr._4_4_ - 1);
  Read<int>::Read((Read<int> *)local_d8,local_f8);
  Adj::~Adj((Adj *)&stack0xfffffffffffffef8);
  uVar1 = e2c.codes.write_.shared_alloc_.direct_ptr._4_4_;
  if (e2c.codes.write_.shared_alloc_.direct_ptr._4_4_ == 0) {
    local_294 = 1;
  }
  else {
    if (e2c.codes.write_.shared_alloc_.direct_ptr._4_4_ == 1) {
      local_29c = 2;
    }
    else {
      if (e2c.codes.write_.shared_alloc_.direct_ptr._4_4_ == 2) {
        local_2a8 = 3;
      }
      else {
        if (e2c.codes.write_.shared_alloc_.direct_ptr._4_4_ == 3) {
          local_2b8 = 4;
        }
        else {
          local_2b8 = 0xffffffff;
        }
        local_2a8 = local_2b8;
      }
      local_29c = local_2a8;
    }
    local_294 = local_29c;
  }
  c2dim.write_.shared_alloc_.direct_ptr._4_4_ = local_294;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_140,"class_dim",(allocator *)((long)&s2dim.write_.shared_alloc_.direct_ptr + 7));
  Mesh::get_array<signed_char>((Mesh *)local_120,(Int)mesh,(string *)(ulong)uVar1);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&s2dim.write_.shared_alloc_.direct_ptr + 7));
  uVar1 = e2c.codes.write_.shared_alloc_.direct_ptr._4_4_ - 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&ncands,"class_dim",
             (allocator *)((long)&cand_codes_w.shared_alloc_.direct_ptr + 7));
  Mesh::get_array<signed_char>((Mesh *)local_158,(Int)mesh,(string *)(ulong)uVar1);
  std::__cxx11::string::~string((string *)&ncands);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&cand_codes_w.shared_alloc_.direct_ptr + 7));
  if (((ulong)(cands2edges->write_).shared_alloc_.alloc & 1) == 0) {
    local_10._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((cands2edges->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((ulong)(cands2edges->write_).shared_alloc_.alloc >> 3);
  }
  size_in = (LO)((ulong)local_10._M_pi >> 2);
  cand_codes_w.shared_alloc_.direct_ptr._0_4_ = size_in;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1b0,"",(allocator *)((long)&f.cand_codes_w.shared_alloc_.direct_ptr + 7));
  Write<signed_char>::Write((Write<signed_char> *)local_190,size_in,(string *)local_1b0);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&f.cand_codes_w.shared_alloc_.direct_ptr + 7));
  Read<signed_char>::Read((Read<signed_char> *)local_258,cand_codes);
  Read<int>::Read((Read<int> *)&f.cand_codes.write_.shared_alloc_.direct_ptr,cands2edges);
  Read<int>::Read((Read<int> *)&f.cands2edges.write_.shared_alloc_.direct_ptr,(Read<int> *)local_98)
  ;
  Read<int>::Read((Read<int> *)&f.e2ec.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&ec_codes.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::Read
            ((Read<signed_char> *)&f.ec2c.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)&cs2s.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::Read
            ((Read<signed_char> *)&f.ec_codes.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)local_120);
  f.c2dim.write_.shared_alloc_.direct_ptr._0_4_ = e2c.codes.write_.shared_alloc_.direct_ptr._4_4_;
  Read<int>::Read((Read<int> *)&f.cell_dim,(Read<int> *)local_d8);
  f.cs2s.write_.shared_alloc_.direct_ptr._0_4_ = c2dim.write_.shared_alloc_.direct_ptr._4_4_;
  Read<signed_char>::Read((Read<signed_char> *)&f.nccs,(Read<signed_char> *)local_158);
  Write<signed_char>::Write
            ((Write<signed_char> *)&f.s2dim.write_.shared_alloc_.direct_ptr,
             (Write<signed_char> *)local_190);
  parallel_for<Omega_h::check_collapse_exposure(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,int)::__0>
            ((LO)cand_codes_w.shared_alloc_.direct_ptr,(type *)local_258,"check_collapse_exposure");
  Write<signed_char>::Write(&local_268,(Write<signed_char> *)local_190);
  Read<signed_char>::Read((Read<signed_char> *)this,&local_268);
  Write<signed_char>::~Write(&local_268);
  check_collapse_exposure(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,int)::$_0::
  ~__0((__0 *)local_258);
  Write<signed_char>::~Write((Write<signed_char> *)local_190);
  Read<signed_char>::~Read((Read<signed_char> *)local_158);
  Read<signed_char>::~Read((Read<signed_char> *)local_120);
  Read<int>::~Read((Read<int> *)local_d8);
  Read<signed_char>::~Read((Read<signed_char> *)&cs2s.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)&ec_codes.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)local_98);
  Adj::~Adj((Adj *)&e2ec.write_.shared_alloc_.direct_ptr);
  RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar2.write_.shared_alloc_;
}

Assistant:

Read<I8> check_collapse_exposure(
    Mesh* mesh, LOs cands2edges, Read<I8> cand_codes, Int cell_dim) {
  auto e2c = mesh->ask_up(EDGE, cell_dim);
  auto e2ec = e2c.a2ab;
  auto ec2c = e2c.ab2b;
  auto ec_codes = e2c.codes;
  auto cs2s = mesh->ask_down(cell_dim, cell_dim - 1).ab2b;
  auto nccs = simplex_degree(cell_dim, cell_dim - 1);
  auto c2dim = mesh->get_array<I8>(cell_dim, "class_dim");
  auto s2dim = mesh->get_array<I8>(cell_dim - 1, "class_dim");
  auto ncands = cands2edges.size();
  auto cand_codes_w = Write<I8>(ncands);
  auto f = OMEGA_H_LAMBDA(LO cand) {
    auto code = cand_codes[cand];
    auto e = cands2edges[cand];
    for (auto ec = e2ec[e]; ec < e2ec[e + 1]; ++ec) {
      auto c = ec2c[ec];
      auto ec_code = ec_codes[ec];
      auto cce = code_which_down(ec_code);
      auto rot = code_rotation(ec_code);
      auto c_dim = c2dim[c];
      for (Int eev_col = 0; eev_col < 2; ++eev_col) {
        if (!collapses(code, eev_col)) continue;
        auto eev_onto = 1 - eev_col;
        auto cev_onto = rot ^ eev_onto;
        auto ccv_onto = simplex_down_template(cell_dim, EDGE, cce, cev_onto);
        auto ccs_opp = simplex_opposite_template(cell_dim, VERT, ccv_onto);
        auto s_opp = cs2s[c * nccs + ccs_opp];
        if (s2dim[s_opp] != c_dim) {
          code = dont_collapse(code, eev_col);
        }
      }
    }
    cand_codes_w[cand] = code;
  };
  parallel_for(ncands, f, "check_collapse_exposure");
  return cand_codes_w;
}